

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentence.h
# Opt level: O1

Sentence * jhu::thrax::tokens<true>(Sentence *__return_storage_ptr__,string_view line)

{
  basic_string_view<char,_std::char_traits<char>_> *pbVar1;
  __normal_iterator<std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
  _Var2;
  pointer pbVar3;
  pointer pbVar4;
  char *in_RCX;
  size_t sVar5;
  Sentence *__range2;
  string_view line_00;
  
  line_00._M_len = line._M_str;
  line_00._M_str = in_RCX;
  split(__return_storage_ptr__,(thrax *)line._M_len,line_00);
  _Var2 = std::
          __remove_if<__gnu_cxx::__normal_iterator<std::basic_string_view<char,std::char_traits<char>>*,std::vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>>,__gnu_cxx::__ops::_Iter_pred<jhu::thrax::tokens<true>(std::basic_string_view<char,std::char_traits<char>>)::_lambda(auto:1)_1_>>
                    ((__return_storage_ptr__->
                     super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start,
                     (__return_storage_ptr__->
                     super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish);
  pbVar1 = (__return_storage_ptr__->
           super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if ((_Var2._M_current != pbVar1) &&
     (pbVar4 = (__return_storage_ptr__->
               super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish,
     pbVar3 = (pointer)((long)_Var2._M_current + ((long)pbVar4 - (long)pbVar1)), pbVar4 != pbVar3))
  {
    (__return_storage_ptr__->
    super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    )._M_impl.super__Vector_impl_data._M_finish = pbVar3;
  }
  pbVar4 = (__return_storage_ptr__->
           super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar3 = (__return_storage_ptr__->
           super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (pbVar4 == pbVar3) {
      return __return_storage_ptr__;
    }
    sVar5 = pbVar4->_M_len;
    if (sVar5 != 0) {
      do {
        sVar5 = sVar5 - 1;
        if (pbVar4->_M_str[sVar5] != ')') break;
        pbVar4->_M_len = sVar5;
      } while (sVar5 != 0);
    }
    pbVar4 = pbVar4 + 1;
  } while( true );
}

Assistant:

Sentence tokens(std::string_view line) {
  auto sentence = split(line);
  if constexpr (!IsParsed) {
    return sentence;
  }
  auto it = std::remove_if(
      sentence.begin(),
      sentence.end(),
      [](auto t) { return t.front() == '('; });
  sentence.erase(it, sentence.end());
  for (auto& t : sentence) {
    while (!t.empty() && t.back() == ')') {
      t.remove_suffix(1);
    }
  }
  return sentence;
}